

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
::Visit<google::protobuf::EnumDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  int iVar1;
  EnumValueDescriptor *descriptor_00;
  EnumValueDescriptorProto *proto_00;
  undefined4 local_24;
  int i;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:6600:25)>_>
  *this_local;
  
  DescriptorBuilder::
  BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)
  ::$_6::operator()(this,descriptor,proto);
  local_24 = 0;
  while( true ) {
    iVar1 = EnumDescriptor::value_count(descriptor);
    if (iVar1 <= local_24) break;
    descriptor_00 = EnumDescriptor::value(descriptor,local_24);
    proto_00 = VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:6600:25)>_>
               ::value((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:6600:25)>_>
                        *)this,proto,local_24);
    Visit<google::protobuf::EnumValueDescriptorProto_const>(this,descriptor_00,proto_00);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }